

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O3

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::VisitSum
          (ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *this,SumExpr e)

{
  ulong uVar1;
  Buffer<char> *pBVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  
  pBVar2 = this->writer_->buffer_;
  sVar4 = pBVar2->size_;
  uVar1 = sVar4 + 1;
  if (pBVar2->capacity_ < uVar1) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar1);
    sVar4 = pBVar2->size_;
  }
  pBVar2->ptr_[sVar4] = '(';
  pBVar2->size_ = uVar1;
  lVar6 = (long)*(int *)((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.
                               super_ExprBase.impl_ + 4);
  if (lVar6 != 0) {
    Visit(this,(NumericExpr)
               ((ExprBase *)
               ((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.impl_
               + 8))->impl_,-1);
    if ((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.impl_ + 0x10
        != (long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.impl_ +
           lVar6 * 8 + 8) {
      lVar5 = 0;
      do {
        pBVar2 = this->writer_->buffer_;
        sVar4 = pBVar2->size_;
        uVar1 = sVar4 + 3;
        if (pBVar2->capacity_ < uVar1) {
          (**pBVar2->_vptr_Buffer)(pBVar2,uVar1);
          sVar4 = pBVar2->size_;
        }
        pcVar3 = pBVar2->ptr_;
        pcVar3[sVar4 + 2] = ' ';
        pcVar3 = pcVar3 + sVar4;
        pcVar3[0] = ' ';
        pcVar3[1] = '+';
        pBVar2->size_ = uVar1;
        Visit(this,(NumericExpr)
                   ((ExprBase *)
                   ((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.
                          impl_ + 0x10 + lVar5))->impl_,-1);
        lVar5 = lVar5 + 8;
      } while (lVar6 * 8 + -8 != lVar5);
    }
  }
  pBVar2 = this->writer_->buffer_;
  sVar4 = pBVar2->size_;
  if (sVar4 == pBVar2->capacity_) {
    (**pBVar2->_vptr_Buffer)(pBVar2,sVar4 + 1);
    sVar4 = pBVar2->size_;
  }
  pBVar2->size_ = sVar4 + 1;
  pBVar2->ptr_[sVar4] = ')';
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::VisitSum(SumExpr e) {
  writer_ << "(";
  typename SumExpr::iterator i = e.begin(), end = e.end();
  if (i != end) {
    Visit(*i);
    for (++i; i != end; ++i) {
      writer_ << " + ";
      Visit(*i);
    }
  }
  writer_ << ')';
}